

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O2

void __thiscall chrono::ChBodyAuxRef::ArchiveOUT(ChBodyAuxRef *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrameMoving<double>_> local_48;
  ChNameValue<chrono::ChFrameMoving<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChBodyAuxRef>(marchive);
  ChBody::ArchiveOUT(&this->super_ChBody,marchive);
  local_30._value = &this->auxref_to_cog;
  local_30._name = "auxref_to_cog";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->auxref_to_abs;
  local_48._name = "auxref_to_abs";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChBodyAuxRef>();

    // serialize parent class
    ChBody::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(auxref_to_cog);
    marchive << CHNVP(auxref_to_abs);
}